

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O0

void __thiscall Assimp::BlobIOStream::~BlobIOStream(BlobIOStream *this)

{
  void *in_RSI;
  BlobIOStream *this_local;
  
  ~BlobIOStream(this);
  Intern::AllocateFromAssimpHeap::operator_delete((AllocateFromAssimpHeap *)this,in_RSI);
  return;
}

Assistant:

BlobIOStream :: ~BlobIOStream()
{
    creator->OnDestruct(file,this);
    delete[] buffer;
}